

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HighsInterface.cpp
# Opt level: O0

HighsStatus __thiscall
Highs::elasticityFilter
          (Highs *this,double global_lower_penalty,double global_upper_penalty,
          double global_rhs_penalty,double *local_lower_penalty,double *local_upper_penalty,
          double *local_rhs_penalty,bool get_infeasible_row,
          vector<int,_std::allocator<int>_> *infeasible_row_subset)

{
  int iVar1;
  size_type sVar2;
  const_reference pvVar3;
  reference pvVar4;
  reference pvVar5;
  double *pdVar6;
  double *lower_bounds;
  double *costs;
  HighsSolution *pHVar7;
  vector<HighsVarType,_std::allocator<HighsVarType>_> *pvVar8;
  vector<double,_std::allocator<double>_> *pvVar9;
  uint *puVar10;
  size_type sVar11;
  uint uVar12;
  pointer in_RCX;
  pointer in_RDX;
  pointer in_RSI;
  Highs *in_RDI;
  undefined1 in_R8B;
  pointer in_XMM0_Qa;
  pointer in_XMM1_Qa;
  pointer in_XMM2_Qa;
  HighsInt iRow_3;
  size_t eCol_3;
  HighsInt iCol_4;
  size_t eCol_2;
  HighsInt num_enforced_row_ecol;
  HighsInt num_enforced_col_ecol;
  HighsModelStatus model_status;
  HighsStatus run_status_1;
  HighsInt iRow_2;
  size_t eCol_1;
  HighsInt iCol_3;
  size_t eCol;
  HighsInt num_fixed;
  bool feasible_model;
  HighsInt loop_k;
  HighsSolution *solution;
  anon_class_16_2_1ead1ca1 solveLp;
  HighsInt iCol_2;
  HighsInt num_new_nz_1;
  HighsInt num_new_col_1;
  double upper_1;
  double lower_1;
  double penalty;
  HighsInt iRow_1;
  bool has_row_names;
  vector<double,_std::allocator<double>_> ecol_value;
  vector<int,_std::allocator<int>_> ecol_index;
  vector<int,_std::allocator<int>_> ecol_start;
  HighsInt row_ecol_offset;
  HighsInt iRow;
  HighsInt iCol_1;
  HighsInt num_new_nz;
  HighsInt num_new_row;
  HighsInt num_new_col;
  HighsInt row_nz;
  double upper_penalty;
  double lower_penalty;
  double upper;
  double lower;
  HighsInt iCol;
  bool has_col_names;
  vector<double,_std::allocator<double>_> col_upper;
  vector<double,_std::allocator<double>_> col_lower;
  HighsInt col_ecol_offset;
  bool has_elastic_rows;
  bool has_global_elastic_rhs;
  bool has_local_rhs_penalty;
  bool has_elastic_columns;
  bool has_elastic_upper;
  bool has_global_elastic_upper;
  bool has_local_upper_penalty;
  bool has_elastic_lower;
  bool has_global_elastic_lower;
  bool has_local_lower_penalty;
  vector<HighsVarType,_std::allocator<HighsVarType>_> all_continuous;
  vector<double,_std::allocator<double>_> zero_costs;
  vector<HighsVarType,_std::allocator<HighsVarType>_> original_integrality;
  vector<double,_std::allocator<double>_> original_col_upper;
  vector<double,_std::allocator<double>_> original_col_lower;
  vector<double,_std::allocator<double>_> original_col_cost;
  HighsInt original_num_row;
  HighsInt original_num_col;
  bool write_model;
  HighsStatus run_status;
  HighsInt evar_ix;
  HighsLp *lp;
  vector<double,_std::allocator<double>_> ecol_upper;
  vector<double,_std::allocator<double>_> ecol_lower;
  vector<double,_std::allocator<double>_> ecol_cost;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  erow_name;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ecol_name;
  vector<double,_std::allocator<double>_> erow_value;
  vector<int,_std::allocator<int>_> erow_index;
  vector<int,_std::allocator<int>_> erow_start;
  vector<double,_std::allocator<double>_> erow_upper;
  vector<double,_std::allocator<double>_> erow_lower;
  vector<double,_std::allocator<double>_> bound_of_col_of_ecol;
  vector<double,_std::allocator<double>_> bound_of_row_of_ecol;
  vector<int,_std::allocator<int>_> row_of_ecol;
  vector<int,_std::allocator<int>_> col_of_ecol;
  value_type *in_stack_fffffffffffff618;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffff620;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffff628;
  Highs *in_stack_fffffffffffff630;
  undefined4 in_stack_fffffffffffff638;
  undefined4 in_stack_fffffffffffff63c;
  string *in_stack_fffffffffffff648;
  HighsInt in_stack_fffffffffffff654;
  uint in_stack_fffffffffffff658;
  uint in_stack_fffffffffffff65c;
  uint uVar13;
  size_type in_stack_fffffffffffff660;
  vector<HighsVarType,_std::allocator<HighsVarType>_> *in_stack_fffffffffffff668;
  undefined4 in_stack_fffffffffffff670;
  undefined4 in_stack_fffffffffffff674;
  undefined4 in_stack_fffffffffffff680;
  HighsInt HVar14;
  HighsStatus in_stack_fffffffffffff684;
  HighsStatus HVar15;
  vector<double,_std::allocator<double>_> *in_stack_fffffffffffff688;
  vector<HighsVarType,_std::allocator<HighsVarType>_> *in_stack_fffffffffffff690;
  HighsInt in_stack_fffffffffffff6dc;
  int iVar16;
  double *in_stack_fffffffffffff6e0;
  double *in_stack_fffffffffffff6e8;
  double *in_stack_fffffffffffff6f0;
  undefined4 in_stack_fffffffffffff6f8;
  HighsInt in_stack_fffffffffffff6fc;
  Highs *in_stack_fffffffffffff700;
  HighsInt num_new_row_00;
  Highs *this_00;
  Highs *in_stack_fffffffffffff708;
  value_type *in_stack_fffffffffffff720;
  undefined4 in_stack_fffffffffffff728;
  int in_stack_fffffffffffff72c;
  double *in_stack_fffffffffffff730;
  double *in_stack_fffffffffffff738;
  HighsInt in_stack_fffffffffffff740;
  HighsInt in_stack_fffffffffffff744;
  Highs *in_stack_fffffffffffff748;
  HighsInt in_stack_fffffffffffff750;
  HighsInt in_stack_fffffffffffff754;
  Highs *in_stack_fffffffffffff758;
  pointer local_870;
  pointer local_868;
  bool local_85c;
  bool local_85b;
  bool local_85a;
  bool local_859;
  size_type local_7f8;
  size_type local_7e8;
  uint local_7dc;
  uint local_7d8;
  vector<double,_std::allocator<double>_> *local_798;
  vector<HighsVarType,_std::allocator<HighsVarType>_> *local_788;
  int local_77c;
  uint local_774;
  int local_6ec;
  string local_6c8 [32];
  string local_6a8 [32];
  string local_688 [32];
  string local_668 [32];
  string local_648 [36];
  undefined4 local_624;
  undefined8 local_620;
  string local_618 [32];
  string local_5f8 [32];
  string local_5d8 [32];
  string local_5b8 [32];
  string local_598 [32];
  value_type local_578;
  double local_570;
  pointer local_568;
  int local_55c;
  byte local_555;
  undefined4 local_554;
  vector<int,_std::allocator<int>_> local_538;
  undefined1 local_520 [112];
  string local_4b0 [32];
  string local_490 [32];
  string local_470 [32];
  string local_450 [32];
  double local_430;
  string local_428 [32];
  string local_408 [32];
  string local_3e8 [8];
  string local_3c8 [32];
  string local_3a8 [32];
  pointer local_388;
  string local_380 [32];
  string local_360 [32];
  string local_340 [32];
  string local_320 [32];
  string local_300 [32];
  pointer local_2e0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_8
  local_2d8;
  value_type local_2c8;
  int local_2bc;
  undefined1 local_2b8 [32];
  vector<double,_std::allocator<double>_> local_298;
  HighsInt local_280;
  bool local_27b;
  undefined1 local_27a;
  byte local_279;
  bool local_278;
  bool local_277;
  undefined1 local_276;
  byte local_275;
  bool local_274;
  undefined1 local_273;
  byte local_272;
  undefined1 local_271;
  __buckets_ptr local_258;
  HighsInt local_1c4;
  HighsInt local_1c0;
  undefined1 local_1b9;
  HighsStatus local_1b8;
  int local_1b4;
  HighsModel *local_1b0;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_160;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_148 [2];
  vector<int,_std::allocator<int>_> local_118;
  vector<int,_std::allocator<int>_> local_100 [3];
  vector<double,_std::allocator<double>_> local_b8 [2];
  vector<int,_std::allocator<int>_> local_88;
  vector<int,_std::allocator<int>_> local_70;
  undefined1 local_49;
  pointer local_48;
  pointer local_40;
  pointer local_38;
  pointer local_30;
  pointer local_28;
  pointer local_20;
  HighsStatus local_c;
  
  local_49 = in_R8B & 1;
  local_48 = in_RCX;
  local_40 = in_RDX;
  local_38 = in_RSI;
  local_30 = in_XMM2_Qa;
  local_28 = in_XMM1_Qa;
  local_20 = in_XMM0_Qa;
  std::vector<int,_std::allocator<int>_>::vector((vector<int,_std::allocator<int>_> *)0x4e0444);
  std::vector<int,_std::allocator<int>_>::vector((vector<int,_std::allocator<int>_> *)0x4e0451);
  std::vector<double,_std::allocator<double>_>::vector
            ((vector<double,_std::allocator<double>_> *)0x4e045e);
  std::vector<double,_std::allocator<double>_>::vector
            ((vector<double,_std::allocator<double>_> *)0x4e046b);
  std::vector<double,_std::allocator<double>_>::vector
            ((vector<double,_std::allocator<double>_> *)0x4e0478);
  std::vector<double,_std::allocator<double>_>::vector
            ((vector<double,_std::allocator<double>_> *)0x4e0485);
  std::vector<int,_std::allocator<int>_>::vector((vector<int,_std::allocator<int>_> *)0x4e0492);
  std::vector<int,_std::allocator<int>_>::vector((vector<int,_std::allocator<int>_> *)0x4e049f);
  std::vector<double,_std::allocator<double>_>::vector
            ((vector<double,_std::allocator<double>_> *)0x4e04ac);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)0x4e04b9);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)0x4e04c6);
  std::vector<double,_std::allocator<double>_>::vector
            ((vector<double,_std::allocator<double>_> *)0x4e04d3);
  std::vector<double,_std::allocator<double>_>::vector
            ((vector<double,_std::allocator<double>_> *)0x4e04e0);
  std::vector<double,_std::allocator<double>_>::vector
            ((vector<double,_std::allocator<double>_> *)0x4e04ed);
  local_1b0 = &in_RDI->model_;
  local_1b4 = (local_1b0->lp_).num_col_;
  local_1b9 = 0;
  local_1c0 = (local_1b0->lp_).num_col_;
  local_1c4 = (in_RDI->model_).lp_.num_row_;
  std::vector<double,_std::allocator<double>_>::vector
            ((vector<double,_std::allocator<double>_> *)
             CONCAT44(in_stack_fffffffffffff674,in_stack_fffffffffffff670),
             (vector<double,_std::allocator<double>_> *)in_stack_fffffffffffff668);
  std::vector<double,_std::allocator<double>_>::vector
            ((vector<double,_std::allocator<double>_> *)
             CONCAT44(in_stack_fffffffffffff674,in_stack_fffffffffffff670),
             (vector<double,_std::allocator<double>_> *)in_stack_fffffffffffff668);
  std::vector<double,_std::allocator<double>_>::vector
            ((vector<double,_std::allocator<double>_> *)
             CONCAT44(in_stack_fffffffffffff674,in_stack_fffffffffffff670),
             (vector<double,_std::allocator<double>_> *)in_stack_fffffffffffff668);
  std::vector<HighsVarType,_std::allocator<HighsVarType>_>::vector
            ((vector<HighsVarType,_std::allocator<HighsVarType>_> *)
             CONCAT44(in_stack_fffffffffffff674,in_stack_fffffffffffff670),in_stack_fffffffffffff668
            );
  std::vector<double,_std::allocator<double>_>::vector
            ((vector<double,_std::allocator<double>_> *)0x4e05c3);
  local_258 = (__buckets_ptr)0x0;
  std::vector<double,_std::allocator<double>_>::assign
            ((vector<double,_std::allocator<double>_> *)in_stack_fffffffffffff620,
             (size_type)in_stack_fffffffffffff618,(value_type_conflict1 *)0x4e05ec);
  std::vector<double,_std::allocator<double>_>::data
            ((vector<double,_std::allocator<double>_> *)0x4e060e);
  local_1b8 = changeColsCost(in_stack_fffffffffffff748,in_stack_fffffffffffff744,
                             in_stack_fffffffffffff740,in_stack_fffffffffffff738);
  if (((local_49 & 1) != 0) &&
     (sVar2 = std::vector<HighsVarType,_std::allocator<HighsVarType>_>::size
                        (&(local_1b0->lp_).integrality_), sVar2 != 0)) {
    std::vector<HighsVarType,_std::allocator<HighsVarType>_>::vector
              ((vector<HighsVarType,_std::allocator<HighsVarType>_> *)0x4e067f);
    local_271 = 0;
    std::vector<HighsVarType,_std::allocator<HighsVarType>_>::assign
              ((vector<HighsVarType,_std::allocator<HighsVarType>_> *)in_stack_fffffffffffff620,
               (size_type)in_stack_fffffffffffff618,(value_type *)0x4e06a4);
    std::vector<HighsVarType,_std::allocator<HighsVarType>_>::data
              ((vector<HighsVarType,_std::allocator<HighsVarType>_> *)0x4e06c6);
    local_1b8 = changeColsIntegrality
                          (in_stack_fffffffffffff748,in_stack_fffffffffffff744,
                           in_stack_fffffffffffff740,(HighsVarType *)in_stack_fffffffffffff738);
    std::vector<HighsVarType,_std::allocator<HighsVarType>_>::~vector
              ((vector<HighsVarType,_std::allocator<HighsVarType>_> *)in_stack_fffffffffffff630);
  }
  local_272 = local_38 != (pointer)0x0;
  local_273 = 0.0 <= (double)local_20;
  local_859 = (bool)local_272 || (bool)local_273;
  local_274 = local_859;
  local_275 = local_40 != (pointer)0x0;
  local_276 = 0.0 <= (double)local_28;
  local_85a = (bool)local_275 || (bool)local_276;
  local_277 = local_85a;
  local_85b = true;
  if (!(bool)local_272 && !(bool)local_273) {
    local_85b = local_85a;
  }
  local_278 = local_85b;
  local_279 = local_48 != (pointer)0x0;
  local_27a = 0.0 <= (double)local_30;
  local_85c = (bool)local_279 || (bool)local_27a;
  local_27b = local_85c;
  local_280 = (local_1b0->lp_).num_col_;
  if (local_85b != false) {
    std::vector<double,_std::allocator<double>_>::vector
              ((vector<double,_std::allocator<double>_> *)0x4e092e);
    std::vector<double,_std::allocator<double>_>::vector
              ((vector<double,_std::allocator<double>_> *)0x4e093b);
    sVar2 = std::
            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::size(&(local_1b0->lp_).col_names_);
    local_2b8[7] = sVar2 != 0;
    local_2b8._0_4_ = 0;
    std::vector<int,_std::allocator<int>_>::push_back
              ((vector<int,_std::allocator<int>_> *)in_stack_fffffffffffff620,
               (value_type_conflict2 *)in_stack_fffffffffffff618);
    for (local_2bc = 0; local_2bc < (local_1b0->lp_).num_col_; local_2bc = local_2bc + 1) {
      pvVar3 = std::vector<double,_std::allocator<double>_>::operator[]
                         (&(local_1b0->lp_).col_lower_,(long)local_2bc);
      local_2c8 = *pvVar3;
      pvVar3 = std::vector<double,_std::allocator<double>_>::operator[]
                         (&(local_1b0->lp_).col_upper_,(long)local_2bc);
      local_2d8._8_8_ = *pvVar3;
      std::vector<double,_std::allocator<double>_>::push_back
                ((vector<double,_std::allocator<double>_> *)in_stack_fffffffffffff630,
                 (value_type_conflict1 *)in_stack_fffffffffffff628);
      std::vector<double,_std::allocator<double>_>::push_back
                ((vector<double,_std::allocator<double>_> *)in_stack_fffffffffffff630,
                 (value_type_conflict1 *)in_stack_fffffffffffff628);
      if ((-INFINITY < local_2c8) || ((double)local_2d8._8_8_ < INFINITY)) {
        if ((local_272 & 1) == 0) {
          local_868 = local_20;
        }
        else {
          local_868 = *(pointer *)(local_38 + (long)local_2bc * 2);
        }
        local_2d8._M_allocated_capacity = (size_type)local_868;
        if ((0.0 <= (double)local_868) || ((double)local_2d8._8_8_ < INFINITY)) {
          if ((local_275 & 1) == 0) {
            local_870 = local_28;
          }
          else {
            local_870 = *(pointer *)(local_40 + (long)local_2bc * 2);
          }
          local_2e0 = local_870;
          if ((-INFINITY < local_2c8) || (0.0 <= (double)local_870)) {
            std::vector<double,_std::allocator<double>_>::push_back
                      ((vector<double,_std::allocator<double>_> *)in_stack_fffffffffffff630,
                       (value_type_conflict1 *)in_stack_fffffffffffff628);
            std::vector<double,_std::allocator<double>_>::push_back
                      ((vector<double,_std::allocator<double>_> *)in_stack_fffffffffffff630,
                       (value_type_conflict1 *)in_stack_fffffffffffff628);
            if ((local_2b8[7] & 1) != 0) {
              std::__cxx11::to_string((int)((ulong)in_stack_fffffffffffff668 >> 0x20));
              std::operator+((char *)in_stack_fffffffffffff628,in_stack_fffffffffffff620);
              std::operator+(in_stack_fffffffffffff628,(char *)in_stack_fffffffffffff620);
              std::
              vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::operator[](&(local_1b0->lp_).col_names_,(long)local_2bc);
              std::operator+(in_stack_fffffffffffff628,in_stack_fffffffffffff620);
              std::operator+(in_stack_fffffffffffff628,(char *)in_stack_fffffffffffff620);
              std::
              vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           *)in_stack_fffffffffffff620,in_stack_fffffffffffff618);
              std::__cxx11::string::~string(local_300);
              std::__cxx11::string::~string(local_320);
              std::__cxx11::string::~string(local_340);
              std::__cxx11::string::~string(local_360);
              std::__cxx11::string::~string(local_380);
            }
            std::vector<int,_std::allocator<int>_>::push_back
                      ((vector<int,_std::allocator<int>_> *)in_stack_fffffffffffff630,
                       (value_type_conflict2 *)in_stack_fffffffffffff628);
            local_388 = (pointer)0x3ff0000000000000;
            std::vector<double,_std::allocator<double>_>::push_back
                      ((vector<double,_std::allocator<double>_> *)in_stack_fffffffffffff620,
                       (value_type_conflict1 *)in_stack_fffffffffffff618);
            if ((-INFINITY < local_2c8) && (0.0 <= (double)local_2d8._M_allocated_capacity)) {
              std::vector<int,_std::allocator<int>_>::push_back
                        ((vector<int,_std::allocator<int>_> *)in_stack_fffffffffffff630,
                         (value_type_conflict2 *)in_stack_fffffffffffff628);
              if ((local_2b8[7] & 1) != 0) {
                std::__cxx11::to_string((int)((ulong)in_stack_fffffffffffff668 >> 0x20));
                std::operator+((char *)in_stack_fffffffffffff628,in_stack_fffffffffffff620);
                std::operator+(in_stack_fffffffffffff628,(char *)in_stack_fffffffffffff620);
                std::
                vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ::operator[](&(local_1b0->lp_).col_names_,(long)local_2bc);
                std::operator+(in_stack_fffffffffffff628,in_stack_fffffffffffff620);
                std::operator+(in_stack_fffffffffffff628,(char *)in_stack_fffffffffffff620);
                std::
                vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             *)in_stack_fffffffffffff620,in_stack_fffffffffffff618);
                std::__cxx11::string::~string(local_3a8);
                std::__cxx11::string::~string(local_3c8);
                std::__cxx11::string::~string(local_3e8);
                std::__cxx11::string::~string(local_408);
                std::__cxx11::string::~string(local_428);
              }
              std::vector<double,_std::allocator<double>_>::push_back
                        ((vector<double,_std::allocator<double>_> *)in_stack_fffffffffffff630,
                         (value_type_conflict1 *)in_stack_fffffffffffff628);
              pvVar4 = std::vector<double,_std::allocator<double>_>::operator[]
                                 (&local_298,(long)local_2bc);
              *pvVar4 = -INFINITY;
              std::vector<int,_std::allocator<int>_>::push_back
                        ((vector<int,_std::allocator<int>_> *)in_stack_fffffffffffff630,
                         (value_type_conflict2 *)in_stack_fffffffffffff628);
              local_430 = 1.0;
              std::vector<double,_std::allocator<double>_>::push_back
                        ((vector<double,_std::allocator<double>_> *)in_stack_fffffffffffff620,
                         (value_type_conflict1 *)in_stack_fffffffffffff618);
              std::vector<double,_std::allocator<double>_>::push_back
                        ((vector<double,_std::allocator<double>_> *)in_stack_fffffffffffff630,
                         (value_type_conflict1 *)in_stack_fffffffffffff628);
              local_1b4 = local_1b4 + 1;
            }
            if (((double)local_2d8._8_8_ < INFINITY) && (0.0 <= (double)local_2e0)) {
              std::vector<int,_std::allocator<int>_>::push_back
                        ((vector<int,_std::allocator<int>_> *)in_stack_fffffffffffff630,
                         (value_type_conflict2 *)in_stack_fffffffffffff628);
              if ((local_2b8[7] & 1) != 0) {
                std::__cxx11::to_string((int)((ulong)in_stack_fffffffffffff668 >> 0x20));
                std::operator+((char *)in_stack_fffffffffffff628,in_stack_fffffffffffff620);
                std::operator+(in_stack_fffffffffffff628,(char *)in_stack_fffffffffffff620);
                std::
                vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ::operator[](&(local_1b0->lp_).col_names_,(long)local_2bc);
                std::operator+(in_stack_fffffffffffff628,in_stack_fffffffffffff620);
                std::operator+(in_stack_fffffffffffff628,(char *)in_stack_fffffffffffff620);
                std::
                vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             *)in_stack_fffffffffffff620,in_stack_fffffffffffff618);
                std::__cxx11::string::~string(local_450);
                std::__cxx11::string::~string(local_470);
                std::__cxx11::string::~string(local_490);
                std::__cxx11::string::~string(local_4b0);
                std::__cxx11::string::~string((string *)(local_520 + 0x50));
              }
              std::vector<double,_std::allocator<double>_>::push_back
                        ((vector<double,_std::allocator<double>_> *)in_stack_fffffffffffff630,
                         (value_type_conflict1 *)in_stack_fffffffffffff628);
              pvVar4 = std::vector<double,_std::allocator<double>_>::operator[]
                                 ((vector<double,_std::allocator<double>_> *)(local_2b8 + 8),
                                  (long)local_2bc);
              *pvVar4 = INFINITY;
              std::vector<int,_std::allocator<int>_>::push_back
                        ((vector<int,_std::allocator<int>_> *)in_stack_fffffffffffff630,
                         (value_type_conflict2 *)in_stack_fffffffffffff628);
              local_520._72_8_ = (pointer)0xbff0000000000000;
              std::vector<double,_std::allocator<double>_>::push_back
                        ((vector<double,_std::allocator<double>_> *)in_stack_fffffffffffff620,
                         (value_type_conflict1 *)in_stack_fffffffffffff618);
              std::vector<double,_std::allocator<double>_>::push_back
                        ((vector<double,_std::allocator<double>_> *)in_stack_fffffffffffff630,
                         (value_type_conflict1 *)in_stack_fffffffffffff628);
              local_1b4 = local_1b4 + 1;
            }
            sVar2 = std::vector<int,_std::allocator<int>_>::size(&local_118);
            local_520._68_4_ = (undefined4)sVar2;
            std::vector<int,_std::allocator<int>_>::push_back
                      ((vector<int,_std::allocator<int>_> *)in_stack_fffffffffffff620,
                       (value_type_conflict2 *)in_stack_fffffffffffff618);
            sVar2 = std::vector<int,_std::allocator<int>_>::size(local_100);
            pvVar5 = std::vector<int,_std::allocator<int>_>::operator[](local_100,sVar2 - 1);
            iVar16 = *pvVar5;
            sVar2 = std::vector<int,_std::allocator<int>_>::size(local_100);
            pvVar5 = std::vector<int,_std::allocator<int>_>::operator[](local_100,sVar2 - 2);
            local_520._64_4_ = iVar16 - *pvVar5;
          }
        }
      }
    }
    sVar2 = std::vector<int,_std::allocator<int>_>::size(&local_70);
    local_520._60_4_ = (undefined4)sVar2;
    sVar2 = std::vector<int,_std::allocator<int>_>::size(local_100);
    local_520._56_4_ = (int)sVar2 + -1;
    pvVar5 = std::vector<int,_std::allocator<int>_>::operator[]
                       (local_100,(long)(int)local_520._56_4_);
    local_520._52_4_ = *pvVar5;
    std::vector<double,_std::allocator<double>_>::data
              ((vector<double,_std::allocator<double>_> *)0x4e13e9);
    std::vector<double,_std::allocator<double>_>::data
              ((vector<double,_std::allocator<double>_> *)0x4e13fe);
    local_1b8 = changeColsBounds(in_stack_fffffffffffff758,in_stack_fffffffffffff754,
                                 in_stack_fffffffffffff750,(double *)in_stack_fffffffffffff748,
                                 (double *)
                                 CONCAT44(in_stack_fffffffffffff744,in_stack_fffffffffffff740));
    local_520._40_8_ = (pointer)0x0;
    std::vector<double,_std::allocator<double>_>::assign
              ((vector<double,_std::allocator<double>_> *)in_stack_fffffffffffff620,
               (size_type)in_stack_fffffffffffff618,(value_type_conflict1 *)0x4e145f);
    std::vector<double,_std::allocator<double>_>::assign
              ((vector<double,_std::allocator<double>_> *)in_stack_fffffffffffff620,
               (size_type)in_stack_fffffffffffff618,(value_type_conflict1 *)0x4e147d);
    std::vector<double,_std::allocator<double>_>::data
              ((vector<double,_std::allocator<double>_> *)0x4e149a);
    std::vector<double,_std::allocator<double>_>::data
              ((vector<double,_std::allocator<double>_> *)0x4e14af);
    std::vector<double,_std::allocator<double>_>::data
              ((vector<double,_std::allocator<double>_> *)0x4e14c4);
    in_stack_fffffffffffff628 =
         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
    local_1b8 = addCols(in_stack_fffffffffffff700,in_stack_fffffffffffff6fc,
                        in_stack_fffffffffffff6f0,in_stack_fffffffffffff6e8,
                        in_stack_fffffffffffff6e0,in_stack_fffffffffffff6dc,
                        (HighsInt *)in_stack_fffffffffffff720,
                        (HighsInt *)CONCAT44(in_stack_fffffffffffff72c,in_stack_fffffffffffff728),
                        in_stack_fffffffffffff730);
    num_new_row_00 = (HighsInt)((ulong)in_stack_fffffffffffff700 >> 0x20);
    HVar14 = (HighsInt)((ulong)in_stack_fffffffffffff6e8 >> 0x20);
    in_stack_fffffffffffff72c = local_520._56_4_;
    in_stack_fffffffffffff730 =
         std::vector<double,_std::allocator<double>_>::data
                   ((vector<double,_std::allocator<double>_> *)0x4e153a);
    std::vector<double,_std::allocator<double>_>::data
              ((vector<double,_std::allocator<double>_> *)0x4e154f);
    std::vector<int,_std::allocator<int>_>::data((vector<int,_std::allocator<int>_> *)0x4e1572);
    in_stack_fffffffffffff618 =
         (value_type *)
         std::vector<int,_std::allocator<int>_>::data((vector<int,_std::allocator<int>_> *)0x4e1587)
    ;
    in_stack_fffffffffffff620 =
         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
         std::vector<double,_std::allocator<double>_>::data
                   ((vector<double,_std::allocator<double>_> *)0x4e159c);
    in_stack_fffffffffffff720 = in_stack_fffffffffffff618;
    local_1b8 = addRows(in_stack_fffffffffffff708,num_new_row_00,
                        (double *)CONCAT44(in_stack_fffffffffffff6fc,in_stack_fffffffffffff6f8),
                        in_stack_fffffffffffff6f0,HVar14,(HighsInt *)in_stack_fffffffffffff6e0,
                        (HighsInt *)in_stack_fffffffffffff618,
                        (double *)CONCAT44(in_stack_fffffffffffff72c,in_stack_fffffffffffff728));
    if ((local_2b8[7] & 1) != 0) {
      for (local_520._36_4_ = 0; (int)local_520._36_4_ < (int)local_520._60_4_;
          local_520._36_4_ = local_520._36_4_ + 1) {
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::operator[](local_148,(long)(int)local_520._36_4_);
        passColName((Highs *)CONCAT44(in_stack_fffffffffffff65c,in_stack_fffffffffffff658),
                    in_stack_fffffffffffff654,in_stack_fffffffffffff648);
      }
      for (local_520._32_4_ = 0; (int)local_520._32_4_ < (int)local_520._56_4_;
          local_520._32_4_ = local_520._32_4_ + 1) {
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::operator[](&local_160,(long)(int)local_520._32_4_);
        passRowName((Highs *)CONCAT44(in_stack_fffffffffffff65c,in_stack_fffffffffffff658),
                    in_stack_fffffffffffff654,in_stack_fffffffffffff648);
      }
    }
    std::vector<double,_std::allocator<double>_>::~vector
              ((vector<double,_std::allocator<double>_> *)in_stack_fffffffffffff630);
    std::vector<double,_std::allocator<double>_>::~vector
              ((vector<double,_std::allocator<double>_> *)in_stack_fffffffffffff630);
  }
  local_520._28_4_ = (local_1b0->lp_).num_col_;
  if ((local_27b & 1U) != 0) {
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::clear((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)0x4e1753);
    std::vector<double,_std::allocator<double>_>::clear
              ((vector<double,_std::allocator<double>_> *)0x4e1760);
    std::vector<int,_std::allocator<int>_>::vector((vector<int,_std::allocator<int>_> *)0x4e1775);
    std::vector<int,_std::allocator<int>_>::vector((vector<int,_std::allocator<int>_> *)0x4e1782);
    std::vector<double,_std::allocator<double>_>::vector
              ((vector<double,_std::allocator<double>_> *)0x4e178f);
    local_554 = 0;
    std::vector<int,_std::allocator<int>_>::push_back
              ((vector<int,_std::allocator<int>_> *)in_stack_fffffffffffff620,
               (value_type_conflict2 *)in_stack_fffffffffffff618);
    sVar2 = std::
            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::size(&(local_1b0->lp_).row_names_);
    local_555 = sVar2 != 0;
    for (local_55c = 0; local_55c < local_1c4; local_55c = local_55c + 1) {
      local_568 = local_30;
      if ((local_279 & 1) != 0) {
        local_568 = *(pointer *)(local_48 + (long)local_55c * 2);
      }
      if (0.0 <= (double)local_568) {
        pvVar3 = std::vector<double,_std::allocator<double>_>::operator[]
                           (&(local_1b0->lp_).row_lower_,(long)local_55c);
        local_570 = *pvVar3;
        pvVar3 = std::vector<double,_std::allocator<double>_>::operator[]
                           (&(local_1b0->lp_).row_upper_,(long)local_55c);
        local_578 = *pvVar3;
        if (-INFINITY < local_570) {
          std::vector<int,_std::allocator<int>_>::push_back
                    ((vector<int,_std::allocator<int>_> *)in_stack_fffffffffffff630,
                     (value_type_conflict2 *)in_stack_fffffffffffff628);
          if ((local_555 & 1) != 0) {
            std::__cxx11::to_string((int)((ulong)in_stack_fffffffffffff668 >> 0x20));
            std::operator+((char *)in_stack_fffffffffffff628,in_stack_fffffffffffff620);
            std::operator+(in_stack_fffffffffffff628,(char *)in_stack_fffffffffffff620);
            std::
            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::operator[](&(local_1b0->lp_).row_names_,(long)local_55c);
            std::operator+(in_stack_fffffffffffff628,in_stack_fffffffffffff620);
            std::operator+(in_stack_fffffffffffff628,(char *)in_stack_fffffffffffff620);
            std::
            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         *)in_stack_fffffffffffff620,in_stack_fffffffffffff618);
            std::__cxx11::string::~string(local_598);
            std::__cxx11::string::~string(local_5b8);
            std::__cxx11::string::~string(local_5d8);
            std::__cxx11::string::~string(local_5f8);
            std::__cxx11::string::~string(local_618);
          }
          std::vector<double,_std::allocator<double>_>::push_back
                    ((vector<double,_std::allocator<double>_> *)in_stack_fffffffffffff630,
                     (value_type_conflict1 *)in_stack_fffffffffffff628);
          std::vector<int,_std::allocator<int>_>::push_back
                    ((vector<int,_std::allocator<int>_> *)in_stack_fffffffffffff630,
                     (value_type_conflict2 *)in_stack_fffffffffffff628);
          local_620 = 0x3ff0000000000000;
          std::vector<double,_std::allocator<double>_>::push_back
                    ((vector<double,_std::allocator<double>_> *)in_stack_fffffffffffff620,
                     (value_type_conflict1 *)in_stack_fffffffffffff618);
          sVar2 = std::vector<int,_std::allocator<int>_>::size(&local_538);
          local_624 = (undefined4)sVar2;
          std::vector<int,_std::allocator<int>_>::push_back
                    ((vector<int,_std::allocator<int>_> *)in_stack_fffffffffffff620,
                     (value_type_conflict2 *)in_stack_fffffffffffff618);
          std::vector<double,_std::allocator<double>_>::push_back
                    ((vector<double,_std::allocator<double>_> *)in_stack_fffffffffffff630,
                     (value_type_conflict1 *)in_stack_fffffffffffff628);
          local_1b4 = local_1b4 + 1;
        }
        if (local_578 < INFINITY) {
          std::vector<int,_std::allocator<int>_>::push_back
                    ((vector<int,_std::allocator<int>_> *)in_stack_fffffffffffff630,
                     (value_type_conflict2 *)in_stack_fffffffffffff628);
          if ((local_555 & 1) != 0) {
            std::__cxx11::to_string((int)((ulong)in_stack_fffffffffffff668 >> 0x20));
            std::operator+((char *)in_stack_fffffffffffff628,in_stack_fffffffffffff620);
            std::operator+(in_stack_fffffffffffff628,(char *)in_stack_fffffffffffff620);
            std::
            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::operator[](&(local_1b0->lp_).row_names_,(long)local_55c);
            std::operator+(in_stack_fffffffffffff628,in_stack_fffffffffffff620);
            std::operator+(in_stack_fffffffffffff628,(char *)in_stack_fffffffffffff620);
            std::
            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         *)in_stack_fffffffffffff620,in_stack_fffffffffffff618);
            std::__cxx11::string::~string(local_648);
            std::__cxx11::string::~string(local_668);
            std::__cxx11::string::~string(local_688);
            std::__cxx11::string::~string(local_6a8);
            std::__cxx11::string::~string(local_6c8);
          }
          std::vector<double,_std::allocator<double>_>::push_back
                    ((vector<double,_std::allocator<double>_> *)in_stack_fffffffffffff630,
                     (value_type_conflict1 *)in_stack_fffffffffffff628);
          std::vector<int,_std::allocator<int>_>::push_back
                    ((vector<int,_std::allocator<int>_> *)in_stack_fffffffffffff630,
                     (value_type_conflict2 *)in_stack_fffffffffffff628);
          std::vector<double,_std::allocator<double>_>::push_back
                    ((vector<double,_std::allocator<double>_> *)in_stack_fffffffffffff620,
                     (value_type_conflict1 *)in_stack_fffffffffffff618);
          std::vector<int,_std::allocator<int>_>::size(&local_538);
          std::vector<int,_std::allocator<int>_>::push_back
                    ((vector<int,_std::allocator<int>_> *)in_stack_fffffffffffff620,
                     (value_type_conflict2 *)in_stack_fffffffffffff618);
          std::vector<double,_std::allocator<double>_>::push_back
                    ((vector<double,_std::allocator<double>_> *)in_stack_fffffffffffff630,
                     (value_type_conflict1 *)in_stack_fffffffffffff628);
          local_1b4 = local_1b4 + 1;
        }
      }
    }
    this_00 = (Highs *)local_520;
    sVar2 = std::vector<int,_std::allocator<int>_>::size
                      ((vector<int,_std::allocator<int>_> *)this_00);
    iVar1 = (int)sVar2 + -1;
    std::vector<int,_std::allocator<int>_>::operator[]
              ((vector<int,_std::allocator<int>_> *)this_00,(long)iVar1);
    std::vector<double,_std::allocator<double>_>::assign
              ((vector<double,_std::allocator<double>_> *)in_stack_fffffffffffff620,
               (size_type)in_stack_fffffffffffff618,(value_type_conflict1 *)0x4e1e77);
    std::vector<double,_std::allocator<double>_>::assign
              ((vector<double,_std::allocator<double>_> *)in_stack_fffffffffffff620,
               (size_type)in_stack_fffffffffffff618,(value_type_conflict1 *)0x4e1e95);
    iVar16 = iVar1;
    pdVar6 = std::vector<double,_std::allocator<double>_>::data
                       ((vector<double,_std::allocator<double>_> *)0x4e1eb2);
    lower_bounds = std::vector<double,_std::allocator<double>_>::data
                             ((vector<double,_std::allocator<double>_> *)0x4e1ec7);
    costs = std::vector<double,_std::allocator<double>_>::data
                      ((vector<double,_std::allocator<double>_> *)0x4e1edc);
    in_stack_fffffffffffff618 =
         (value_type *)
         std::vector<int,_std::allocator<int>_>::data((vector<int,_std::allocator<int>_> *)0x4e1eff)
    ;
    in_stack_fffffffffffff620 =
         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
         std::vector<int,_std::allocator<int>_>::data((vector<int,_std::allocator<int>_> *)0x4e1f14)
    ;
    in_stack_fffffffffffff628 =
         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
         std::vector<double,_std::allocator<double>_>::data
                   ((vector<double,_std::allocator<double>_> *)0x4e1f29);
    local_1b8 = addCols(this_00,in_stack_fffffffffffff6fc,costs,lower_bounds,pdVar6,iVar16,
                        (HighsInt *)in_stack_fffffffffffff720,
                        (HighsInt *)CONCAT44(in_stack_fffffffffffff72c,in_stack_fffffffffffff728),
                        in_stack_fffffffffffff730);
    if ((local_555 & 1) != 0) {
      for (local_6ec = 0; local_6ec < iVar1; local_6ec = local_6ec + 1) {
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::operator[](local_148,(long)local_6ec);
        passColName((Highs *)CONCAT44(in_stack_fffffffffffff65c,in_stack_fffffffffffff658),
                    in_stack_fffffffffffff654,in_stack_fffffffffffff648);
      }
    }
    std::vector<double,_std::allocator<double>_>::~vector
              ((vector<double,_std::allocator<double>_> *)in_stack_fffffffffffff630);
    std::vector<int,_std::allocator<int>_>::~vector
              ((vector<int,_std::allocator<int>_> *)in_stack_fffffffffffff630);
    std::vector<int,_std::allocator<int>_>::~vector
              ((vector<int,_std::allocator<int>_> *)in_stack_fffffffffffff630);
  }
  local_1b8 = elasticityFilter::anon_class_16_2_1ead1ca1::operator()
                        ((anon_class_16_2_1ead1ca1 *)
                         CONCAT44(in_stack_fffffffffffff63c,in_stack_fffffffffffff638));
  if (local_1b8 == kOk) {
    if ((local_49 & 1) == 0) {
      std::vector<double,_std::allocator<double>_>::vector
                ((vector<double,_std::allocator<double>_> *)
                 CONCAT44(in_stack_fffffffffffff674,in_stack_fffffffffffff670),
                 (vector<double,_std::allocator<double>_> *)in_stack_fffffffffffff668);
      std::vector<HighsVarType,_std::allocator<HighsVarType>_>::vector
                ((vector<HighsVarType,_std::allocator<HighsVarType>_> *)
                 CONCAT44(in_stack_fffffffffffff674,in_stack_fffffffffffff670),
                 in_stack_fffffffffffff668);
      local_c = elasticityFilterReturn
                          ((Highs *)CONCAT44(in_stack_fffffffffffff674,in_stack_fffffffffffff670),
                           (HighsStatus)((ulong)in_stack_fffffffffffff668 >> 0x20),
                           SUB81((ulong)in_stack_fffffffffffff668 >> 0x18,0),
                           (HighsInt)(in_stack_fffffffffffff660 >> 0x20),
                           (HighsInt)in_stack_fffffffffffff660,
                           (vector<double,_std::allocator<double>_> *)
                           CONCAT44(in_stack_fffffffffffff65c,in_stack_fffffffffffff658),
                           (vector<double,_std::allocator<double>_> *)
                           CONCAT44(in_stack_fffffffffffff684,in_stack_fffffffffffff680),
                           in_stack_fffffffffffff688,in_stack_fffffffffffff690);
      std::vector<HighsVarType,_std::allocator<HighsVarType>_>::~vector
                ((vector<HighsVarType,_std::allocator<HighsVarType>_> *)in_stack_fffffffffffff630);
      std::vector<double,_std::allocator<double>_>::~vector
                ((vector<double,_std::allocator<double>_> *)in_stack_fffffffffffff630);
    }
    else {
      pHVar7 = getSolution(in_RDI);
      local_774 = 0;
      while( true ) {
        local_77c = 0;
        if ((local_278 & 1U) != 0) {
          local_788 = (vector<HighsVarType,_std::allocator<HighsVarType>_> *)0x0;
          while (in_stack_fffffffffffff690 = local_788,
                pvVar8 = (vector<HighsVarType,_std::allocator<HighsVarType>_> *)
                         std::vector<int,_std::allocator<int>_>::size(&local_70),
                in_stack_fffffffffffff690 < pvVar8) {
            std::vector<int,_std::allocator<int>_>::operator[](&local_70,(size_type)local_788);
            pvVar3 = std::vector<double,_std::allocator<double>_>::operator[]
                               (&pHVar7->col_value,
                                (long)&(local_788->
                                       super__Vector_base<HighsVarType,_std::allocator<HighsVarType>_>
                                       )._M_impl.super__Vector_impl_data._M_start + (long)local_280)
            ;
            pdVar6 = &(in_RDI->options_).super_HighsOptionsStruct.primal_feasibility_tolerance;
            if (*pdVar6 <= *pvVar3 && *pvVar3 != *pdVar6) {
              changeColBounds(in_stack_fffffffffffff630,
                              (HighsInt)((ulong)in_stack_fffffffffffff628 >> 0x20),
                              (double)in_stack_fffffffffffff620,(double)in_stack_fffffffffffff618);
              local_77c = local_77c + 1;
            }
            local_788 = (vector<HighsVarType,_std::allocator<HighsVarType>_> *)
                        ((long)&(local_788->
                                super__Vector_base<HighsVarType,_std::allocator<HighsVarType>_>).
                                _M_impl.super__Vector_impl_data._M_start + 1);
          }
        }
        if ((local_27b & 1U) != 0) {
          local_798 = (vector<double,_std::allocator<double>_> *)0x0;
          while (in_stack_fffffffffffff688 = local_798,
                pvVar9 = (vector<double,_std::allocator<double>_> *)
                         std::vector<int,_std::allocator<int>_>::size(&local_88),
                in_stack_fffffffffffff688 < pvVar9) {
            std::vector<int,_std::allocator<int>_>::operator[](&local_88,(size_type)local_798);
            pvVar3 = std::vector<double,_std::allocator<double>_>::operator[]
                               (&pHVar7->col_value,
                                (long)&(local_798->
                                       super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                                       super__Vector_impl_data._M_start +
                                (long)(int)local_520._28_4_);
            pdVar6 = &(in_RDI->options_).super_HighsOptionsStruct.primal_feasibility_tolerance;
            if (*pdVar6 <= *pvVar3 && *pvVar3 != *pdVar6) {
              changeColBounds(in_stack_fffffffffffff630,
                              (HighsInt)((ulong)in_stack_fffffffffffff628 >> 0x20),
                              (double)in_stack_fffffffffffff620,(double)in_stack_fffffffffffff618);
              local_77c = local_77c + 1;
            }
            local_798 = (vector<double,_std::allocator<double>_> *)
                        ((long)&(local_798->super__Vector_base<double,_std::allocator<double>_>).
                                _M_impl.super__Vector_impl_data._M_start + 1);
          }
        }
        if (local_77c == 0) break;
        in_stack_fffffffffffff684 =
             elasticityFilter::anon_class_16_2_1ead1ca1::operator()
                       ((anon_class_16_2_1ead1ca1 *)
                        CONCAT44(in_stack_fffffffffffff63c,in_stack_fffffffffffff638));
        if (in_stack_fffffffffffff684 != kOk) {
          HVar14 = local_1c4;
          HVar15 = in_stack_fffffffffffff684;
          std::vector<double,_std::allocator<double>_>::vector
                    ((vector<double,_std::allocator<double>_> *)
                     CONCAT44(in_stack_fffffffffffff684,in_stack_fffffffffffff670),
                     (vector<double,_std::allocator<double>_> *)in_stack_fffffffffffff668);
          std::vector<HighsVarType,_std::allocator<HighsVarType>_>::vector
                    ((vector<HighsVarType,_std::allocator<HighsVarType>_> *)
                     CONCAT44(in_stack_fffffffffffff684,in_stack_fffffffffffff670),
                     in_stack_fffffffffffff668);
          local_c = elasticityFilterReturn
                              ((Highs *)CONCAT44(in_stack_fffffffffffff684,in_stack_fffffffffffff670
                                                ),
                               (HighsStatus)((ulong)in_stack_fffffffffffff668 >> 0x20),
                               SUB81((ulong)in_stack_fffffffffffff668 >> 0x18,0),
                               (HighsInt)(in_stack_fffffffffffff660 >> 0x20),
                               (HighsInt)in_stack_fffffffffffff660,
                               (vector<double,_std::allocator<double>_> *)
                               CONCAT44(in_stack_fffffffffffff65c,in_stack_fffffffffffff658),
                               (vector<double,_std::allocator<double>_> *)CONCAT44(HVar15,HVar14),
                               in_stack_fffffffffffff688,in_stack_fffffffffffff690);
          std::vector<HighsVarType,_std::allocator<HighsVarType>_>::~vector
                    ((vector<HighsVarType,_std::allocator<HighsVarType>_> *)
                     in_stack_fffffffffffff630);
          std::vector<double,_std::allocator<double>_>::~vector
                    ((vector<double,_std::allocator<double>_> *)in_stack_fffffffffffff630);
          goto LAB_004e2a71;
        }
        in_stack_fffffffffffff668 =
             (vector<HighsVarType,_std::allocator<HighsVarType>_> *)getModelStatus(in_RDI);
        if (*(int *)&(in_stack_fffffffffffff668->
                     super__Vector_base<HighsVarType,_std::allocator<HighsVarType>_>)._M_impl.
                     super__Vector_impl_data._M_start == 8) break;
        local_774 = local_774 + 1;
      }
      std::vector<int,_std::allocator<int>_>::clear((vector<int,_std::allocator<int>_> *)0x4e2706);
      local_7d8 = 0;
      local_7dc = 0;
      if ((local_278 & 1U) != 0) {
        local_7e8 = 0;
        while (in_stack_fffffffffffff660 = local_7e8,
              sVar2 = std::vector<int,_std::allocator<int>_>::size(&local_70),
              in_stack_fffffffffffff660 < sVar2) {
          puVar10 = (uint *)std::vector<int,_std::allocator<int>_>::operator[](&local_70,local_7e8);
          uVar13 = *puVar10;
          pvVar3 = std::vector<double,_std::allocator<double>_>::operator[]
                             (&(local_1b0->lp_).col_upper_,(long)local_280 + local_7e8);
          if ((*pvVar3 == 0.0) && (!NAN(*pvVar3))) {
            local_7d8 = local_7d8 + 1;
            uVar12 = (uint)local_7e8;
            in_stack_fffffffffffff658 = local_280 + uVar12;
            pvVar4 = std::vector<double,_std::allocator<double>_>::operator[](local_b8,local_7e8);
            printf("Col e-col %2d (column %2d) corresponds to column %2d with bound %g and is enforced\n"
                   ,*pvVar4,(ulong)uVar12,(ulong)in_stack_fffffffffffff658,(ulong)uVar13);
            in_stack_fffffffffffff65c = uVar13;
          }
          local_7e8 = local_7e8 + 1;
        }
      }
      if ((local_27b & 1U) != 0) {
        local_7f8 = 0;
        while (sVar2 = local_7f8, sVar11 = std::vector<int,_std::allocator<int>_>::size(&local_88),
              sVar2 < sVar11) {
          std::vector<int,_std::allocator<int>_>::operator[](&local_88,local_7f8);
          pvVar3 = std::vector<double,_std::allocator<double>_>::operator[]
                             (&(local_1b0->lp_).col_upper_,(long)(int)local_520._28_4_ + local_7f8);
          if ((*pvVar3 == 0.0) && (!NAN(*pvVar3))) {
            local_7dc = local_7dc + 1;
            std::vector<int,_std::allocator<int>_>::push_back
                      ((vector<int,_std::allocator<int>_> *)in_stack_fffffffffffff630,
                       (value_type_conflict2 *)in_stack_fffffffffffff628);
          }
          local_7f8 = local_7f8 + 1;
        }
      }
      highsLogUser(&(in_RDI->options_).super_HighsOptionsStruct.log_options,kInfo,
                   "Elasticity filter after %d passes enforces bounds on %d cols and %d rows\n",
                   (ulong)local_774,(ulong)local_7d8,(ulong)local_7dc);
      std::vector<double,_std::allocator<double>_>::vector
                ((vector<double,_std::allocator<double>_> *)
                 CONCAT44(in_stack_fffffffffffff674,in_stack_fffffffffffff670),
                 (vector<double,_std::allocator<double>_> *)in_stack_fffffffffffff668);
      std::vector<HighsVarType,_std::allocator<HighsVarType>_>::vector
                ((vector<HighsVarType,_std::allocator<HighsVarType>_> *)
                 CONCAT44(in_stack_fffffffffffff674,in_stack_fffffffffffff670),
                 in_stack_fffffffffffff668);
      local_c = elasticityFilterReturn
                          ((Highs *)CONCAT44(in_stack_fffffffffffff674,in_stack_fffffffffffff670),
                           (HighsStatus)((ulong)in_stack_fffffffffffff668 >> 0x20),
                           SUB81((ulong)in_stack_fffffffffffff668 >> 0x18,0),
                           (HighsInt)(in_stack_fffffffffffff660 >> 0x20),
                           (HighsInt)in_stack_fffffffffffff660,
                           (vector<double,_std::allocator<double>_> *)
                           CONCAT44(in_stack_fffffffffffff65c,in_stack_fffffffffffff658),
                           (vector<double,_std::allocator<double>_> *)
                           CONCAT44(in_stack_fffffffffffff684,in_stack_fffffffffffff680),
                           in_stack_fffffffffffff688,in_stack_fffffffffffff690);
      std::vector<HighsVarType,_std::allocator<HighsVarType>_>::~vector
                ((vector<HighsVarType,_std::allocator<HighsVarType>_> *)in_stack_fffffffffffff630);
      std::vector<double,_std::allocator<double>_>::~vector
                ((vector<double,_std::allocator<double>_> *)in_stack_fffffffffffff630);
    }
  }
  else {
    std::vector<double,_std::allocator<double>_>::vector
              ((vector<double,_std::allocator<double>_> *)
               CONCAT44(in_stack_fffffffffffff674,in_stack_fffffffffffff670),
               (vector<double,_std::allocator<double>_> *)in_stack_fffffffffffff668);
    std::vector<HighsVarType,_std::allocator<HighsVarType>_>::vector
              ((vector<HighsVarType,_std::allocator<HighsVarType>_> *)
               CONCAT44(in_stack_fffffffffffff674,in_stack_fffffffffffff670),
               in_stack_fffffffffffff668);
    local_c = elasticityFilterReturn
                        ((Highs *)CONCAT44(in_stack_fffffffffffff674,in_stack_fffffffffffff670),
                         (HighsStatus)((ulong)in_stack_fffffffffffff668 >> 0x20),
                         SUB81((ulong)in_stack_fffffffffffff668 >> 0x18,0),
                         (HighsInt)(in_stack_fffffffffffff660 >> 0x20),
                         (HighsInt)in_stack_fffffffffffff660,
                         (vector<double,_std::allocator<double>_> *)
                         CONCAT44(in_stack_fffffffffffff65c,in_stack_fffffffffffff658),
                         (vector<double,_std::allocator<double>_> *)
                         CONCAT44(in_stack_fffffffffffff684,in_stack_fffffffffffff680),
                         in_stack_fffffffffffff688,in_stack_fffffffffffff690);
    std::vector<HighsVarType,_std::allocator<HighsVarType>_>::~vector
              ((vector<HighsVarType,_std::allocator<HighsVarType>_> *)in_stack_fffffffffffff630);
    std::vector<double,_std::allocator<double>_>::~vector
              ((vector<double,_std::allocator<double>_> *)in_stack_fffffffffffff630);
  }
LAB_004e2a71:
  std::vector<double,_std::allocator<double>_>::~vector
            ((vector<double,_std::allocator<double>_> *)in_stack_fffffffffffff630);
  std::vector<HighsVarType,_std::allocator<HighsVarType>_>::~vector
            ((vector<HighsVarType,_std::allocator<HighsVarType>_> *)in_stack_fffffffffffff630);
  std::vector<double,_std::allocator<double>_>::~vector
            ((vector<double,_std::allocator<double>_> *)in_stack_fffffffffffff630);
  std::vector<double,_std::allocator<double>_>::~vector
            ((vector<double,_std::allocator<double>_> *)in_stack_fffffffffffff630);
  std::vector<double,_std::allocator<double>_>::~vector
            ((vector<double,_std::allocator<double>_> *)in_stack_fffffffffffff630);
  std::vector<double,_std::allocator<double>_>::~vector
            ((vector<double,_std::allocator<double>_> *)in_stack_fffffffffffff630);
  std::vector<double,_std::allocator<double>_>::~vector
            ((vector<double,_std::allocator<double>_> *)in_stack_fffffffffffff630);
  std::vector<double,_std::allocator<double>_>::~vector
            ((vector<double,_std::allocator<double>_> *)in_stack_fffffffffffff630);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)in_stack_fffffffffffff630);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)in_stack_fffffffffffff630);
  std::vector<double,_std::allocator<double>_>::~vector
            ((vector<double,_std::allocator<double>_> *)in_stack_fffffffffffff630);
  std::vector<int,_std::allocator<int>_>::~vector
            ((vector<int,_std::allocator<int>_> *)in_stack_fffffffffffff630);
  std::vector<int,_std::allocator<int>_>::~vector
            ((vector<int,_std::allocator<int>_> *)in_stack_fffffffffffff630);
  std::vector<double,_std::allocator<double>_>::~vector
            ((vector<double,_std::allocator<double>_> *)in_stack_fffffffffffff630);
  std::vector<double,_std::allocator<double>_>::~vector
            ((vector<double,_std::allocator<double>_> *)in_stack_fffffffffffff630);
  std::vector<double,_std::allocator<double>_>::~vector
            ((vector<double,_std::allocator<double>_> *)in_stack_fffffffffffff630);
  std::vector<double,_std::allocator<double>_>::~vector
            ((vector<double,_std::allocator<double>_> *)in_stack_fffffffffffff630);
  std::vector<int,_std::allocator<int>_>::~vector
            ((vector<int,_std::allocator<int>_> *)in_stack_fffffffffffff630);
  std::vector<int,_std::allocator<int>_>::~vector
            ((vector<int,_std::allocator<int>_> *)in_stack_fffffffffffff630);
  return local_c;
}

Assistant:

HighsStatus Highs::elasticityFilter(
    const double global_lower_penalty, const double global_upper_penalty,
    const double global_rhs_penalty, const double* local_lower_penalty,
    const double* local_upper_penalty, const double* local_rhs_penalty,
    const bool get_infeasible_row,
    std::vector<HighsInt>& infeasible_row_subset) {
  //  this->writeModel("infeasible.mps");
  // Solve the feasibility relaxation problem for the given penalties,
  // continuing to act as the elasticity filter get_infeasible_row is
  // true, resulting in an infeasibility subset for further refinement
  // as an IIS
  //
  // Construct the e-LP:
  //
  // Constraints L <= Ax <= U; l <= x <= u
  //
  // Transformed to
  //
  // L <= Ax + e_L - e_U <= U,
  //
  // l <=  x + e_l - e_u <= u,
  //
  // where the elastic variables are not used if the corresponding
  // bound is infinite or the local/global penalty is negative.
  //
  // x is free, and the objective is the linear function of the
  // elastic variables given by the local/global penalties
  //
  // col_of_ecol lists the column indices corresponding to the entries in
  // bound_of_col_of_ecol so that the results can be interpreted
  //
  // row_of_ecol lists the row indices corresponding to the entries in
  // bound_of_row_of_ecol so that the results can be interpreted
  std::vector<HighsInt> col_of_ecol;
  std::vector<HighsInt> row_of_ecol;
  std::vector<double> bound_of_row_of_ecol;
  std::vector<double> bound_of_col_of_ecol;
  std::vector<double> erow_lower;
  std::vector<double> erow_upper;
  std::vector<HighsInt> erow_start;
  std::vector<HighsInt> erow_index;
  std::vector<double> erow_value;
  // Accumulate names for ecols and erows, re-using ecol_name for the
  // names of row ecols after defining the names of col ecols
  std::vector<std::string> ecol_name;
  std::vector<std::string> erow_name;
  std::vector<double> ecol_cost;
  std::vector<double> ecol_lower;
  std::vector<double> ecol_upper;
  const HighsLp& lp = this->model_.lp_;
  HighsInt evar_ix = lp.num_col_;
  HighsStatus run_status;
  const bool write_model = false;
  // Take copies of the original model dimensions and column data
  // vectors, as they will be modified in forming the e-LP
  const HighsInt original_num_col = lp.num_col_;
  const HighsInt original_num_row = lp.num_row_;
  const std::vector<double> original_col_cost = lp.col_cost_;
  const std::vector<double> original_col_lower = lp.col_lower_;
  const std::vector<double> original_col_upper = lp.col_upper_;
  const std::vector<HighsVarType> original_integrality = lp.integrality_;
  // Zero the column costs
  std::vector<double> zero_costs;
  zero_costs.assign(original_num_col, 0);
  run_status = this->changeColsCost(0, lp.num_col_ - 1, zero_costs.data());
  assert(run_status == HighsStatus::kOk);

  if (get_infeasible_row && lp.integrality_.size()) {
    // Set any integrality to continuous
    std::vector<HighsVarType> all_continuous;
    all_continuous.assign(original_num_col, HighsVarType::kContinuous);
    run_status =
        this->changeColsIntegrality(0, lp.num_col_ - 1, all_continuous.data());
    assert(run_status == HighsStatus::kOk);
  }

  // For the columns
  const bool has_local_lower_penalty = local_lower_penalty;
  const bool has_global_elastic_lower = global_lower_penalty >= 0;
  const bool has_elastic_lower =
      has_local_lower_penalty || has_global_elastic_lower;
  const bool has_local_upper_penalty = local_upper_penalty;
  const bool has_global_elastic_upper = global_upper_penalty >= 0;
  const bool has_elastic_upper =
      has_local_upper_penalty || has_global_elastic_upper;
  const bool has_elastic_columns = has_elastic_lower || has_elastic_upper;
  // For the rows
  const bool has_local_rhs_penalty = local_rhs_penalty;
  const bool has_global_elastic_rhs = global_rhs_penalty >= 0;
  const bool has_elastic_rows = has_local_rhs_penalty || has_global_elastic_rhs;
  assert(has_elastic_columns || has_elastic_rows);

  const HighsInt col_ecol_offset = lp.num_col_;
  if (has_elastic_columns) {
    // Accumulate bounds to be used for columns
    std::vector<double> col_lower;
    std::vector<double> col_upper;
    // When defining names, need to know the column number
    const bool has_col_names = lp.col_names_.size() > 0;
    erow_start.push_back(0);
    for (HighsInt iCol = 0; iCol < lp.num_col_; iCol++) {
      const double lower = lp.col_lower_[iCol];
      const double upper = lp.col_upper_[iCol];
      // Original bounds used unless e-variable introduced
      col_lower.push_back(lower);
      col_upper.push_back(upper);
      // Free columns have no erow
      if (lower <= -kHighsInf && upper >= kHighsInf) continue;

      // Get the penalty for violating the lower bounds on this column
      const double lower_penalty = has_local_lower_penalty
                                       ? local_lower_penalty[iCol]
                                       : global_lower_penalty;
      // Negative lower penalty and infinite upper bound implies that the
      // bounds cannot be violated
      if (lower_penalty < 0 && upper >= kHighsInf) continue;

      // Get the penalty for violating the upper bounds on this column
      const double upper_penalty = has_local_upper_penalty
                                       ? local_upper_penalty[iCol]
                                       : global_upper_penalty;
      // Infinite upper bound and negative lower penalty implies that the
      // bounds cannot be violated
      if (lower <= -kHighsInf && upper_penalty < 0) continue;
      erow_lower.push_back(lower);
      erow_upper.push_back(upper);
      if (has_col_names)
        erow_name.push_back("row_" + std::to_string(iCol) + "_" +
                            lp.col_names_[iCol] + "_erow");
      // Define the entry for x[iCol]
      erow_index.push_back(iCol);
      erow_value.push_back(1);
      if (lower > -kHighsInf && lower_penalty >= 0) {
        // New e_l variable
        col_of_ecol.push_back(iCol);
        if (has_col_names)
          ecol_name.push_back("col_" + std::to_string(iCol) + "_" +
                              lp.col_names_[iCol] + "_lower");
        // Save the original lower bound on this column and free its
        // lower bound
        bound_of_col_of_ecol.push_back(lower);
        col_lower[iCol] = -kHighsInf;
        erow_index.push_back(evar_ix);
        erow_value.push_back(1);
        ecol_cost.push_back(lower_penalty);
        evar_ix++;
      }
      if (upper < kHighsInf && upper_penalty >= 0) {
        // New e_u variable
        col_of_ecol.push_back(iCol);
        if (has_col_names)
          ecol_name.push_back("col_" + std::to_string(iCol) + "_" +
                              lp.col_names_[iCol] + "_upper");
        // Save the original upper bound on this column and free its
        // upper bound
        bound_of_col_of_ecol.push_back(upper);
        col_upper[iCol] = kHighsInf;
        erow_index.push_back(evar_ix);
        erow_value.push_back(-1);
        ecol_cost.push_back(upper_penalty);
        evar_ix++;
      }
      erow_start.push_back(erow_index.size());
      HighsInt row_nz =
          erow_start[erow_start.size() - 1] - erow_start[erow_start.size() - 2];
      //      printf("eRow for column %d has %d nonzeros\n", int(iCol),
      //      int(row_nz));
      assert(row_nz == 2 || row_nz == 3);
    }
    HighsInt num_new_col = col_of_ecol.size();
    HighsInt num_new_row = erow_start.size() - 1;
    HighsInt num_new_nz = erow_start[num_new_row];
    if (kIisDevReport)
      printf(
          "Elasticity filter: For columns there are %d variables and %d "
          "constraints\n",
          int(num_new_col), int(num_new_row));
    // Apply the original column bound changes
    assert(col_lower.size() == static_cast<size_t>(lp.num_col_));
    assert(col_upper.size() == static_cast<size_t>(lp.num_col_));
    run_status = this->changeColsBounds(0, lp.num_col_ - 1, col_lower.data(),
                                        col_upper.data());
    assert(run_status == HighsStatus::kOk);
    // Add the new columns
    ecol_lower.assign(num_new_col, 0);
    ecol_upper.assign(num_new_col, kHighsInf);
    run_status = this->addCols(num_new_col, ecol_cost.data(), ecol_lower.data(),
                               ecol_upper.data(), 0, nullptr, nullptr, nullptr);
    assert(run_status == HighsStatus::kOk);
    // Add the new rows
    assert(erow_start.size() == static_cast<size_t>(num_new_row + 1));
    assert(erow_index.size() == static_cast<size_t>(num_new_nz));
    assert(erow_value.size() == static_cast<size_t>(num_new_nz));
    run_status = this->addRows(num_new_row, erow_lower.data(),
                               erow_upper.data(), num_new_nz, erow_start.data(),
                               erow_index.data(), erow_value.data());
    assert(run_status == HighsStatus::kOk);
    if (has_col_names) {
      for (HighsInt iCol = 0; iCol < num_new_col; iCol++)
        this->passColName(col_ecol_offset + iCol, ecol_name[iCol]);
      for (HighsInt iRow = 0; iRow < num_new_row; iRow++)
        this->passRowName(original_num_row + iRow, erow_name[iRow]);
    }
    assert(ecol_cost.size() == static_cast<size_t>(num_new_col));
    assert(ecol_lower.size() == static_cast<size_t>(num_new_col));
    assert(ecol_upper.size() == static_cast<size_t>(num_new_col));
    if (write_model) {
      printf("\nAfter adding %d e-rows\n=============\n", int(num_new_col));
      bool output_flag;
      run_status = this->getOptionValue("output_flag", output_flag);
      this->setOptionValue("output_flag", true);
      this->writeModel("");
      this->setOptionValue("output_flag", output_flag);
    }
  }
  const HighsInt row_ecol_offset = lp.num_col_;
  if (has_elastic_rows) {
    // Add the columns corresponding to the e_L and e_U variables for
    // the constraints
    ecol_name.clear();
    ecol_cost.clear();
    std::vector<HighsInt> ecol_start;
    std::vector<HighsInt> ecol_index;
    std::vector<double> ecol_value;
    ecol_start.push_back(0);
    const bool has_row_names = lp.row_names_.size() > 0;
    for (HighsInt iRow = 0; iRow < original_num_row; iRow++) {
      // Get the penalty for violating the bounds on this row
      const double penalty =
          has_local_rhs_penalty ? local_rhs_penalty[iRow] : global_rhs_penalty;
      // Negative penalty implies that the bounds cannot be violated
      if (penalty < 0) continue;
      const double lower = lp.row_lower_[iRow];
      const double upper = lp.row_upper_[iRow];
      if (lower > -kHighsInf) {
        // Create an e-var for the row lower bound
        row_of_ecol.push_back(iRow);
        if (has_row_names)
          ecol_name.push_back("row_" + std::to_string(iRow) + "_" +
                              lp.row_names_[iRow] + "_lower");
        bound_of_row_of_ecol.push_back(lower);
        // Define the sub-matrix column
        ecol_index.push_back(iRow);
        ecol_value.push_back(1);
        ecol_start.push_back(ecol_index.size());
        ecol_cost.push_back(penalty);
        evar_ix++;
      }
      if (upper < kHighsInf) {
        // Create an e-var for the row upper bound
        row_of_ecol.push_back(iRow);
        if (has_row_names)
          ecol_name.push_back("row_" + std::to_string(iRow) + "_" +
                              lp.row_names_[iRow] + "_upper");
        bound_of_row_of_ecol.push_back(upper);
        // Define the sub-matrix column
        ecol_index.push_back(iRow);
        ecol_value.push_back(-1);
        ecol_start.push_back(ecol_index.size());
        ecol_cost.push_back(penalty);
        evar_ix++;
      }
    }
    HighsInt num_new_col = ecol_start.size() - 1;
    HighsInt num_new_nz = ecol_start[num_new_col];
    ecol_lower.assign(num_new_col, 0);
    ecol_upper.assign(num_new_col, kHighsInf);
    assert(ecol_cost.size() == static_cast<size_t>(num_new_col));
    assert(ecol_lower.size() == static_cast<size_t>(num_new_col));
    assert(ecol_upper.size() == static_cast<size_t>(num_new_col));
    assert(ecol_start.size() == static_cast<size_t>(num_new_col + 1));
    assert(ecol_index.size() == static_cast<size_t>(num_new_nz));
    assert(ecol_value.size() == static_cast<size_t>(num_new_nz));
    run_status = this->addCols(num_new_col, ecol_cost.data(), ecol_lower.data(),
                               ecol_upper.data(), num_new_nz, ecol_start.data(),
                               ecol_index.data(), ecol_value.data());
    assert(run_status == HighsStatus::kOk);
    if (has_row_names) {
      for (HighsInt iCol = 0; iCol < num_new_col; iCol++)
        this->passColName(row_ecol_offset + iCol, ecol_name[iCol]);
    }

    if (write_model) {
      bool output_flag;
      printf("\nAfter adding %d e-cols\n=============\n", int(num_new_col));
      run_status = this->getOptionValue("output_flag", output_flag);
      this->setOptionValue("output_flag", true);
      this->writeModel("");
      this->setOptionValue("output_flag", output_flag);
    }
  }

  if (write_model) this->writeModel("elastic.mps");

  // Lambda for gathering data when solving an LP
  auto solveLp = [&]() -> HighsStatus {
    HighsIisInfo iis_info;
    iis_info.simplex_time = -this->getRunTime();
    iis_info.simplex_iterations = -info_.simplex_iteration_count;
    run_status = this->run();
    assert(run_status == HighsStatus::kOk);
    if (run_status != HighsStatus::kOk) return run_status;
    iis_info.simplex_time += this->getRunTime();
    iis_info.simplex_iterations += info_.simplex_iteration_count;
    this->iis_.info_.push_back(iis_info);
    return run_status;
  };

  run_status = solveLp();

  if (run_status != HighsStatus::kOk)
    return elasticityFilterReturn(run_status, false, original_num_col,
                                  original_num_row, original_col_cost,
                                  original_col_lower, original_col_upper,
                                  original_integrality);
  if (kIisDevReport) this->writeSolution("", kSolutionStylePretty);
  // Model status should be optimal, unless model is unbounded
  assert(this->model_status_ == HighsModelStatus::kOptimal ||
         this->model_status_ == HighsModelStatus::kUnbounded);

  if (!get_infeasible_row)
    return elasticityFilterReturn(HighsStatus::kOk, false, original_num_col,
                                  original_num_row, original_col_cost,
                                  original_col_lower, original_col_upper,
                                  original_integrality);
  const HighsSolution& solution = this->getSolution();
  // Now fix e-variables that are positive and re-solve until e-LP is infeasible
  HighsInt loop_k = 0;
  bool feasible_model = false;
  for (;;) {
    if (kIisDevReport)
      printf("\nElasticity filter pass %d\n==============\n", int(loop_k));
    HighsInt num_fixed = 0;
    if (has_elastic_columns) {
      for (size_t eCol = 0; eCol < col_of_ecol.size(); eCol++) {
        HighsInt iCol = col_of_ecol[eCol];
        if (solution.col_value[col_ecol_offset + eCol] >
            this->options_.primal_feasibility_tolerance) {
          if (kIisDevReport)
            printf(
                "E-col %2d (column %2d) corresponds to column %2d with bound "
                "%g "
                "and has solution value %g\n",
                int(eCol), int(col_ecol_offset + eCol), int(iCol),
                bound_of_col_of_ecol[eCol],
                solution.col_value[col_ecol_offset + eCol]);
          this->changeColBounds(col_ecol_offset + eCol, 0, 0);
          num_fixed++;
        }
      }
    }
    if (has_elastic_rows) {
      for (size_t eCol = 0; eCol < row_of_ecol.size(); eCol++) {
        HighsInt iRow = row_of_ecol[eCol];
        if (solution.col_value[row_ecol_offset + eCol] >
            this->options_.primal_feasibility_tolerance) {
          if (kIisDevReport)
            printf(
                "E-row %2d (column %2d) corresponds to    row %2d with bound "
                "%g "
                "and has solution value %g\n",
                int(eCol), int(row_ecol_offset + eCol), int(iRow),
                bound_of_row_of_ecol[eCol],
                solution.col_value[row_ecol_offset + eCol]);
          this->changeColBounds(row_ecol_offset + eCol, 0, 0);
          num_fixed++;
        }
      }
    }
    if (num_fixed == 0) {
      // No elastic variables were positive, so problem is feasible
      feasible_model = true;
      break;
    }
    HighsStatus run_status = solveLp();
    if (run_status != HighsStatus::kOk)
      return elasticityFilterReturn(run_status, feasible_model,
                                    original_num_col, original_num_row,
                                    original_col_cost, original_col_lower,
                                    original_col_upper, original_integrality);
    if (kIisDevReport) this->writeSolution("", kSolutionStylePretty);
    HighsModelStatus model_status = this->getModelStatus();
    if (model_status == HighsModelStatus::kInfeasible) break;
    loop_k++;
  }

  infeasible_row_subset.clear();
  HighsInt num_enforced_col_ecol = 0;
  HighsInt num_enforced_row_ecol = 0;
  if (has_elastic_columns) {
    for (size_t eCol = 0; eCol < col_of_ecol.size(); eCol++) {
      HighsInt iCol = col_of_ecol[eCol];
      if (lp.col_upper_[col_ecol_offset + eCol] == 0) {
        num_enforced_col_ecol++;
        printf(
            "Col e-col %2d (column %2d) corresponds to column %2d with bound "
            "%g "
            "and is enforced\n",
            int(eCol), int(col_ecol_offset + eCol), int(iCol),
            bound_of_col_of_ecol[eCol]);
      }
    }
  }
  if (has_elastic_rows) {
    for (size_t eCol = 0; eCol < row_of_ecol.size(); eCol++) {
      HighsInt iRow = row_of_ecol[eCol];
      if (lp.col_upper_[row_ecol_offset + eCol] == 0) {
        num_enforced_row_ecol++;
        infeasible_row_subset.push_back(iRow);
        if (kIisDevReport)
          printf(
              "Row e-col %2d (column %2d) corresponds to    row %2d with bound "
              "%g and is enforced\n",
              int(eCol), int(row_ecol_offset + eCol), int(iRow),
              bound_of_row_of_ecol[eCol]);
      }
    }
  }
  if (feasible_model)
    assert(num_enforced_col_ecol == 0 && num_enforced_row_ecol == 0);

  highsLogUser(
      options_.log_options, HighsLogType::kInfo,
      "Elasticity filter after %d passes enforces bounds on %d cols and %d "
      "rows\n",
      int(loop_k), int(num_enforced_col_ecol), int(num_enforced_row_ecol));

  if (kIisDevReport)
    printf(
        "\nElasticity filter after %d passes enforces bounds on %d cols and %d "
        "rows\n",
        int(loop_k), int(num_enforced_col_ecol), int(num_enforced_row_ecol));

  return elasticityFilterReturn(HighsStatus::kOk, feasible_model,
                                original_num_col, original_num_row,
                                original_col_cost, original_col_lower,
                                original_col_upper, original_integrality);
}